

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::cleanUp(CFG *this)

{
  ostream *poVar1;
  
  eliminateEpsilonProductions(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eliminated epsilon productions: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  printReadable(this);
  eliminateUnitProductions(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eliminated unit productions: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  printReadable(this);
  eliminateUselessSymbols(this);
  return;
}

Assistant:

void CFG::cleanUp() {
    eliminateEpsilonProductions();

    std::cout << "Eliminated epsilon productions: " << std::endl;
    printReadable();

    eliminateUnitProductions();

    std::cout << "Eliminated unit productions: " << std::endl;
    printReadable();

    eliminateUselessSymbols();
}